

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.cpp
# Opt level: O3

void duckdb::IntegerAverageOperationHugeint::Finalize<double,duckdb::AvgState<duckdb::hugeint_t>>
               (AvgState<duckdb::hugeint_t> *state,double *target,
               AggregateFinalizeData *finalize_data)

{
  FunctionData *result;
  hugeint_t input;
  longdouble local_44;
  longdouble local_38;
  uint64_t local_20;
  
  local_20 = state->count;
  if (local_20 != 0) {
    result = (finalize_data->input->bind_data).ptr;
    local_38 = (longdouble)CONCAT28(local_38._8_2_,result);
    local_44 = (longdouble)(long)local_20 +
               (longdouble)*(float *)(&DAT_01db3ee8 + (ulong)((long)local_20 < 0) * 4);
    if (result != (FunctionData *)0x0) {
      optional_ptr<duckdb::FunctionData,_true>::CheckValid
                ((optional_ptr<duckdb::FunctionData,_true> *)&local_38);
      local_44 = local_44 * (longdouble)(double)local_38._0_8_[1]._vptr_FunctionData;
    }
    local_38 = (longdouble)0;
    input.upper = (int64_t)&local_38;
    input.lower = (state->value).upper;
    Hugeint::TryCast<long_double>((Hugeint *)(state->value).lower,input,(longdouble *)result);
    *target = (double)(local_38 / local_44);
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.count == 0) {
			finalize_data.ReturnNull();
		} else {
			long double divident = GetAverageDivident<long double>(state.count, finalize_data.input.bind_data);
			target = Hugeint::Cast<long double>(state.value) / divident;
		}
	}